

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

bool __thiscall google::protobuf::MapKey::operator==(MapKey *this,MapKey *other)

{
  CppType CVar1;
  byte *in_RSI;
  byte *in_RDI;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  LogMessage *in_stack_fffffffffffffee0;
  LogMessage *this_00;
  undefined8 in_stack_fffffffffffffee8;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  MapKey *in_stack_ffffffffffffff40;
  LogMessage local_98 [2];
  byte *local_18;
  __type local_1;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_18 = in_RSI;
  if (*(int *)(in_RDI + 8) != *(int *)(in_RSI + 8)) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffedc);
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffee0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    internal::LogMessage::~LogMessage((LogMessage *)0x439ae4);
  }
  CVar1 = type(in_stack_ffffffffffffff40);
  switch((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (ulong)(CVar1 - CPPTYPE_INT32)) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    local_1 = *(int *)in_RDI == *(int *)local_18;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    local_1 = *(long *)in_RDI == *(long *)local_18;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    local_1 = *(int *)in_RDI == *(int *)local_18;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    local_1 = *(long *)in_RDI == *(long *)local_18;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9:
    in_stack_fffffffffffffef0 = local_98;
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffedc);
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffee0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    internal::LogMessage::~LogMessage((LogMessage *)0x439b99);
  default:
    this_00 = (LogMessage *)&stack0xffffffffffffff28;
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffef0,level,(char *)this_00,in_stack_fffffffffffffedc);
    internal::LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    internal::LogMessage::~LogMessage((LogMessage *)0x439cf5);
    local_1 = false;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
    local_1 = (*in_RDI & 1) == (*local_18 & 1);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8:
    local_1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (ulong)(CVar1 - CPPTYPE_INT32),in_stack_fffffffffffffef8);
  }
  return local_1;
}

Assistant:

bool operator==(const MapKey& other) const {
    if (type_ != other.type_) {
      // To be consistent with operator<, we don't allow this either.
      GOOGLE_LOG(FATAL) << "Unsupported: type mismatch";
    }
    switch (type()) {
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case FieldDescriptor::CPPTYPE_STRING:
        return *val_.string_value_ == *other.val_.string_value_;
      case FieldDescriptor::CPPTYPE_INT64:
        return val_.int64_value_ == other.val_.int64_value_;
      case FieldDescriptor::CPPTYPE_INT32:
        return val_.int32_value_ == other.val_.int32_value_;
      case FieldDescriptor::CPPTYPE_UINT64:
        return val_.uint64_value_ == other.val_.uint64_value_;
      case FieldDescriptor::CPPTYPE_UINT32:
        return val_.uint32_value_ == other.val_.uint32_value_;
      case FieldDescriptor::CPPTYPE_BOOL:
        return val_.bool_value_ == other.val_.bool_value_;
    }
    GOOGLE_LOG(FATAL) << "Can't get here.";
    return false;
  }